

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_b8 [4];
  int code;
  sigset_t sigs_to_catch;
  int sig;
  int i;
  ithread_t cmdloop_thread;
  char *pcStack_20;
  int rc;
  char *iface;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pcStack_20 = (char *)0x0;
  sigs_to_catch.__val[0xf]._4_4_ = 0;
  iface = (char *)argv;
  argv_local._0_4_ = argc;
  SampleUtil_Initialize(linux_print);
  sigs_to_catch.__val[0xf]._4_4_ = 1;
  do {
    if ((int)argv_local <= sigs_to_catch.__val[0xf]._4_4_) {
      cmdloop_thread._4_4_ = TvCtrlPointStart(pcStack_20,(state_update)0x0,0);
      if (cmdloop_thread._4_4_ == 0) {
        iVar1 = pthread_create((pthread_t *)&sig,(pthread_attr_t *)0x0,TvCtrlPointCommandLoop,
                               (void *)0x0);
        if (iVar1 == 0) {
          sigemptyset((sigset_t *)local_b8);
          sigaddset((sigset_t *)local_b8,2);
          sigwait((sigset_t *)local_b8,(int *)(sigs_to_catch.__val + 0xf));
          SampleUtil_Print("Shutting down on signal %d...\n",(ulong)(uint)sigs_to_catch.__val[0xf]);
          argv_local._4_4_ = TvCtrlPointStop();
        }
        else {
          argv_local._4_4_ = -0x38f;
        }
      }
      else {
        SampleUtil_Print("Error starting UPnP TV Control Point\n");
        argv_local._4_4_ = cmdloop_thread._4_4_;
      }
      return argv_local._4_4_;
    }
    iVar1 = strcmp(*(char **)(iface + (long)sigs_to_catch.__val[0xf]._4_4_ * 8),"-i");
    if (iVar1 == 0) {
      sigs_to_catch.__val[0xf]._4_4_ = sigs_to_catch.__val[0xf]._4_4_ + 1;
      pcStack_20 = *(char **)(iface + (long)sigs_to_catch.__val[0xf]._4_4_ * 8);
    }
    else {
      iVar1 = strcmp(*(char **)(iface + (long)sigs_to_catch.__val[0xf]._4_4_ * 8),"-help");
      if (iVar1 == 0) {
        SampleUtil_Print("Usage: %s -i interface -help (this message)\n",*(undefined8 *)iface);
        SampleUtil_Print("\tinterface:     interface address of the control point\n\t\te.g.: eth0\n"
                        );
        return 1;
      }
    }
    sigs_to_catch.__val[0xf]._4_4_ = sigs_to_catch.__val[0xf]._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	(void)argc;
	(void)argv;
	char *iface = NULL;
	int rc;
	ithread_t cmdloop_thread;
	int i = 0;
#ifdef _WIN32
#else
	int sig;
	sigset_t sigs_to_catch;
#endif
	int code;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -help (this message)\n",
				argv[0]);
			SampleUtil_Print("\tinterface:     interface address "
					 "of the control point\n"
					 "\t\te.g.: eth0\n");
			return 1;
		}
	}

	rc = TvCtrlPointStart(iface, NULL, 0);
	if (rc != TV_SUCCESS) {
		SampleUtil_Print("Error starting UPnP TV Control Point\n");
		return rc;
	}
	/* start a command loop thread */
	code = ithread_create(
		&cmdloop_thread, NULL, TvCtrlPointCommandLoop, NULL);
	if (code != 0) {
		return UPNP_E_INTERNAL_ERROR;
	}
#ifdef _WIN32
	ithread_join(cmdloop_thread, NULL);
#else
	/* Catch Ctrl-C and properly shutdown */
	sigemptyset(&sigs_to_catch);
	sigaddset(&sigs_to_catch, SIGINT);
	sigwait(&sigs_to_catch, &sig);
	SampleUtil_Print("Shutting down on signal %d...\n", sig);
#endif
	rc = TvCtrlPointStop();

	return rc;
}